

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  long lVar1;
  long lVar2;
  real *prVar3;
  real *prVar4;
  undefined1 auVar5 [16];
  real *prVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [64];
  
  lVar1 = this->m_;
  if (A->m_ != lVar1) {
    __assert_fail("A.m_ == m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x43,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  lVar2 = A->n_;
  if (lVar2 == vec->m_) {
    if (0 < lVar1) {
      prVar3 = this->data_;
      prVar6 = A->data_;
      prVar4 = vec->data_;
      lVar7 = 0;
      do {
        prVar3[lVar7] = 0.0;
        if (0 < lVar2) {
          auVar9 = ZEXT464((uint)prVar3[lVar7]);
          lVar8 = 0;
          do {
            auVar5 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)prVar6[lVar8]),
                                     ZEXT416((uint)prVar4[lVar8]));
            auVar9 = ZEXT1664(auVar5);
            prVar3[lVar7] = auVar5._0_4_;
            lVar8 = lVar8 + 1;
          } while (lVar2 != lVar8);
        }
        lVar7 = lVar7 + 1;
        prVar6 = prVar6 + lVar2;
      } while (lVar7 != lVar1);
    }
    return;
  }
  __assert_fail("A.n_ == vec.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x44,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.m_ == m_);
  assert(A.n_ == vec.m_);
  for (int64_t i = 0; i < m_; i++) {
    data_[i] = 0.0;
    for (int64_t j = 0; j < A.n_; j++) {
      data_[i] += A.data_[i * A.n_ + j] * vec.data_[j];
    }
  }
}